

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

BOOL __thiscall
Memory::PreReservedVirtualAllocWrapper::Free
          (PreReservedVirtualAllocWrapper *this,LPVOID lpAddress,size_t dwSize,DWORD dwFreeType)

{
  LPVOID pvVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint index;
  undefined4 *puVar5;
  ulong uVar6;
  uint uStack_58;
  BVIndex freeSegmentsBVIndex;
  size_t requestedNumOfSegments;
  BOOL success;
  AutoCriticalSection local_38;
  AutoCriticalSection autocs;
  DWORD dwFreeType_local;
  size_t dwSize_local;
  LPVOID lpAddress_local;
  PreReservedVirtualAllocWrapper *this_local;
  
  autocs.cs._4_4_ = dwFreeType;
  AutoCriticalSection::AutoCriticalSection(&local_38,&this->cs);
  if (dwSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x1b0,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local._4_4_ = 0;
  }
  else if (this->preReservedStartAddress == (LPVOID)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x1b6,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local._4_4_ = 0;
  }
  else {
    if ((dwSize & 0xfff) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x1ba,"(dwSize % AutoSystemInfo::PageSize == 0)",
                         "dwSize % AutoSystemInfo::PageSize == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local._4_4_ = VirtualFree(lpAddress,dwSize,0x4000);
    uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    uVar6 = dwSize / uVar4;
    if (0xffffffff < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x1bf,"(requestedNumOfSegments <= ((uint32_t)~((uint32_t)0)))",
                         "requestedNumOfSegments <= MAXUINT32");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((this_local._4_4_ != 0) &&
       (Output::Trace(PreReservedHeapAllocPhase,L"MEM_DECOMMIT: Address: 0x%p of size: 0x%x bytes\n"
                      ,lpAddress,dwSize), (autocs.cs._4_4_ & 0x8000) != 0)) {
      if (lpAddress < this->preReservedStartAddress) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1c8,"((uintptr_t) lpAddress >= (uintptr_t) preReservedStartAddress)",
                           "(uintptr_t) lpAddress >= (uintptr_t) preReservedStartAddress");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
      if (((ulong)lpAddress & (ulong)(uVar4 - 1)) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1c9,
                           "(((uintptr_t)lpAddress & (AutoSystemInfo::Data.GetAllocationGranularityPageCount() - 1)) == 0)"
                           ,"Not aligned with Allocation Granularity?");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      if (dwSize % (ulong)uVar4 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1ca,
                           "(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0)"
                           ,"Release size should match the allocation granularity size");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (uVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1cb,"(requestedNumOfSegments != 0)","requestedNumOfSegments != 0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pvVar1 = this->preReservedStartAddress;
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      index = (uint)((ulong)((long)lpAddress - (long)pvVar1) / (ulong)uVar4);
      if (0xfff < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                           ,0x1ce,"(freeSegmentsBVIndex < PreReservedAllocationSegmentCount)",
                           "Invalid Index ?");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      uStack_58 = (uint)uVar6;
      BVStatic<4096UL>::SetRange(&this->freeSegments,index,uStack_58);
      uVar4 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      Output::Trace(PreReservedHeapAllocPhase,
                    L"MEM_RELEASE: Address: 0x%p of size: 0x%x * 0x%x bytes\n",lpAddress,uVar6,
                    (ulong)uVar4);
    }
  }
  AutoCriticalSection::~AutoCriticalSection(&local_38);
  return this_local._4_4_;
}

Assistant:

BOOL
PreReservedVirtualAllocWrapper::Free(LPVOID lpAddress, size_t dwSize, DWORD dwFreeType)
{
    {
        AutoCriticalSection autocs(&this->cs);

        if (dwSize == 0)
        {
            Assert(false);
            return FALSE;
        }

        if (preReservedStartAddress == nullptr)
        {
            Assert(false);
            return FALSE;
        }

        Assert(dwSize % AutoSystemInfo::PageSize == 0);
#pragma warning(suppress: 6250)
#pragma warning(suppress: 28160) // Calling VirtualFreeEx without the MEM_RELEASE flag frees memory but not address descriptors (VADs)
        BOOL success = VirtualFree(lpAddress, dwSize, MEM_DECOMMIT);
        size_t requestedNumOfSegments = dwSize / AutoSystemInfo::Data.GetAllocationGranularityPageSize();
        Assert(requestedNumOfSegments <= MAXUINT32);

        if (success)
        {
            PreReservedHeapTrace(_u("MEM_DECOMMIT: Address: 0x%p of size: 0x%x bytes\n"), lpAddress, dwSize);
        }

        if (success && (dwFreeType & MEM_RELEASE) != 0)
        {
            Assert((uintptr_t) lpAddress >= (uintptr_t) preReservedStartAddress);
            AssertMsg(((uintptr_t)lpAddress & (AutoSystemInfo::Data.GetAllocationGranularityPageCount() - 1)) == 0, "Not aligned with Allocation Granularity?");
            AssertMsg(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0, "Release size should match the allocation granularity size");
            Assert(requestedNumOfSegments != 0);

            BVIndex freeSegmentsBVIndex = (BVIndex) (((uintptr_t) lpAddress - (uintptr_t) preReservedStartAddress) / AutoSystemInfo::Data.GetAllocationGranularityPageSize());
            AssertMsg(freeSegmentsBVIndex < PreReservedAllocationSegmentCount, "Invalid Index ?");
            freeSegments.SetRange(freeSegmentsBVIndex, static_cast<uint>(requestedNumOfSegments));
            PreReservedHeapTrace(_u("MEM_RELEASE: Address: 0x%p of size: 0x%x * 0x%x bytes\n"), lpAddress, requestedNumOfSegments, AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        }

        return success;
    }
}